

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void __thiscall CLPIParser::Extent_Start_Point(CLPIParser *this,uint8_t *buffer,uint dataLength)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  BitStreamReader reader;
  BitStreamReader local_48;
  
  local_48.super_BitStream.m_totalBits = 0;
  local_48.super_BitStream.m_buffer = (uint *)0x0;
  local_48.super_BitStream.m_initBuffer = (uint *)0x0;
  local_48.m_curVal = 0;
  local_48.m_bitLeft = 0;
  BitStream::setBuffer(&local_48.super_BitStream,buffer,buffer + dataLength);
  local_48._24_8_ = local_48._24_8_ & 0xffffffff;
  local_48.m_curVal = BitStreamReader::getCurVal(&local_48,local_48.super_BitStream.m_buffer);
  local_48.m_bitLeft = 0x20;
  BitStreamReader::skipBits(&local_48,0x20);
  BitStreamReader::skipBits(&local_48,0x10);
  uVar1 = BitStreamReader::getBits(&local_48,0x10);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->SPN_extent_start,(long)(int)uVar1);
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      uVar2 = BitStreamReader::getBits(&local_48,0x20);
      (this->SPN_extent_start).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar3] = uVar2;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return;
}

Assistant:

void CLPIParser::Extent_Start_Point(uint8_t* buffer, const unsigned dataLength)
{
    BitStreamReader reader{};
    reader.setBuffer(buffer, buffer + dataLength);
    reader.skipBits(32);  // length

    reader.skipBits(16);  // reserved_for_future_use
    const int number_of_extent_start_points = reader.getBits<int>(16);
    SPN_extent_start.resize(number_of_extent_start_points);
    for (int i = 0; i < number_of_extent_start_points; ++i)
    {
        SPN_extent_start[i] = reader.getBits(32);
    }
}